

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cpp
# Opt level: O3

int IsOffloadDisabled(void)

{
  int iVar1;
  
  if (TargetOffloadPolicy == tgt_default) {
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&TargetOffloadMtx);
    if (iVar1 != 0) {
      std::__throw_system_error(iVar1);
    }
    if (TargetOffloadPolicy == tgt_default) {
      iVar1 = omp_get_num_devices();
      TargetOffloadPolicy = (uint)(0 < iVar1) * 2;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&TargetOffloadMtx);
  }
  return (uint)(TargetOffloadPolicy == tgt_disabled);
}

Assistant:

static int IsOffloadDisabled() {
  if (TargetOffloadPolicy == tgt_default) HandleDefaultTargetOffload();
  return TargetOffloadPolicy == tgt_disabled;
}